

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::BVHNIntersector1<4,_257,_false,_embree::sse2::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  undefined1 (*pauVar14) [16];
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 (*pauVar23) [16];
  undefined4 uVar24;
  ulong unaff_R15;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  vfloat4 a0;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar68;
  float fVar69;
  float fVar70;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar71 [12];
  float fVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar77;
  float fVar78;
  vfloat4 a;
  undefined1 auVar79 [16];
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar88;
  float fVar91;
  float fVar92;
  float fVar94;
  undefined1 auVar89 [16];
  float fVar93;
  float fVar95;
  undefined1 auVar90 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  vfloat<4> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_10a8 [16];
  ulong local_1090;
  Intersectors *local_1088;
  RayQueryContext *local_1080;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8 [4];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_1080 = context;
  local_1088 = This;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_fd8 = (ray->super_RayK<1>).dir.field_0.m128[0];
    local_fe8 = (ray->super_RayK<1>).dir.field_0.m128[1];
    local_fc8 = (ray->super_RayK<1>).dir.field_0.m128[2];
    fVar30 = (ray->super_RayK<1>).dir.field_0.m128[3];
    fVar29 = local_fe8 * local_fe8;
    fVar31 = local_fc8 * local_fc8;
    fVar32 = fVar30 * fVar30;
    fVar49 = fVar29 + local_fd8 * local_fd8 + fVar31;
    auVar57._0_8_ = CONCAT44(fVar29 + fVar29 + fVar32,fVar49);
    auVar57._8_4_ = fVar29 + fVar31 + fVar31;
    auVar57._12_4_ = fVar29 + fVar32 + fVar32;
    auVar45._8_4_ = auVar57._8_4_;
    auVar45._0_8_ = auVar57._0_8_;
    auVar45._12_4_ = auVar57._12_4_;
    auVar57 = rsqrtss(auVar45,auVar57);
    fVar29 = auVar57._0_4_;
    local_fb8[0] = fVar29 * 1.5 - fVar29 * fVar29 * fVar49 * 0.5 * fVar29;
    fVar29 = local_fd8 * local_fb8[0];
    fVar31 = local_fe8 * local_fb8[0];
    fVar32 = local_fc8 * local_fb8[0];
    fVar77 = -fVar31;
    fVar49 = -fVar32;
    auVar71._8_4_ = 0xffffffff;
    auVar71._0_8_ = 0xffffffffffffffff;
    if (fVar77 * fVar77 + fVar32 * fVar32 + 0.0 <= fVar29 * fVar29 + fVar49 * fVar49 + 0.0) {
      auVar71 = SUB1612((undefined1  [16])0x0,0);
    }
    fVar68 = (float)((uint)fVar32 & auVar71._4_4_);
    fVar49 = (float)(~auVar71._0_4_ & (uint)fVar49);
    fVar70 = (float)(~auVar71._8_4_ & (uint)fVar29 | (uint)fVar77 & auVar71._8_4_);
    fVar77 = fVar68 * fVar68;
    fVar69 = fVar70 * fVar70;
    fVar78 = fVar77 + fVar49 * fVar49 + fVar69;
    auVar73._0_8_ = CONCAT44(fVar77 + fVar77 + 0.0,fVar78);
    auVar73._8_4_ = fVar77 + fVar69 + fVar69;
    auVar73._12_4_ = fVar77 + 0.0 + 0.0;
    auVar79._8_4_ = auVar73._8_4_;
    auVar79._0_8_ = auVar73._0_8_;
    auVar79._12_4_ = auVar73._12_4_;
    auVar57 = rsqrtss(auVar79,auVar73);
    fVar77 = auVar57._0_4_;
    fVar77 = fVar77 * 1.5 - fVar77 * fVar77 * fVar78 * 0.5 * fVar77;
    fVar49 = fVar77 * fVar49;
    fVar68 = fVar77 * fVar68;
    fVar70 = fVar77 * fVar70;
    fVar69 = fVar68 * fVar29 - fVar31 * fVar49;
    fVar78 = fVar70 * fVar31 - fVar32 * fVar68;
    fVar74 = fVar49 * fVar32 - fVar29 * fVar70;
    fVar76 = fVar77 * 0.0 * fVar30 * local_fb8[0] - fVar30 * local_fb8[0] * fVar77 * 0.0;
    fVar77 = fVar78 * fVar78;
    fVar75 = fVar74 * fVar74;
    fVar76 = fVar76 * fVar76;
    fVar80 = fVar75 + fVar77 + fVar69 * fVar69;
    fVar81 = fVar76 + fVar77 + fVar77;
    fVar75 = fVar75 + fVar77 + fVar75;
    fVar76 = fVar76 + fVar77 + fVar76;
    auVar67._4_4_ = fVar81;
    auVar67._0_4_ = fVar80;
    auVar67._8_4_ = fVar75;
    auVar67._12_4_ = fVar76;
    auVar52._4_4_ = fVar81;
    auVar52._0_4_ = fVar80;
    auVar52._8_4_ = fVar75;
    auVar52._12_4_ = fVar76;
    auVar57 = rsqrtss(auVar67,auVar52);
    fVar77 = auVar57._0_4_;
    fVar77 = fVar77 * 1.5 - fVar77 * fVar77 * fVar80 * 0.5 * fVar77;
    local_f88._4_4_ = fVar77 * fVar69;
    local_f88._0_4_ = fVar70;
    local_f88._8_4_ = local_fb8[0] * fVar32;
    local_f88._12_4_ = 0;
    local_f98._4_4_ = fVar77 * fVar74;
    local_f98._0_4_ = fVar68;
    local_f98._8_4_ = local_fb8[0] * fVar31;
    local_f98._12_4_ = 0;
    local_fa8._4_4_ = fVar77 * fVar78;
    local_fa8._0_4_ = fVar49;
    local_fa8._8_4_ = local_fb8[0] * fVar29;
    local_fa8._12_4_ = 0;
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      pauVar23 = (undefined1 (*) [16])local_f68;
      local_1048 = (ray->super_RayK<1>).org.field_0.m128[0];
      local_1058 = (ray->super_RayK<1>).org.field_0.m128[1];
      local_1018 = (ray->super_RayK<1>).org.field_0.m128[2];
      fVar29 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      local_1028 = 0.0;
      if (0.0 <= fVar29) {
        local_1028 = fVar29;
      }
      fVar29 = (ray->super_RayK<1>).tfar;
      fVar31 = 0.0;
      if (0.0 <= fVar29) {
        fVar31 = fVar29;
      }
      uVar25 = -(uint)((float)DAT_01ff1d40 <= ABS(local_fd8));
      uVar26 = -(uint)(DAT_01ff1d40._4_4_ <= ABS(local_fe8));
      uVar27 = -(uint)(DAT_01ff1d40._8_4_ <= ABS(local_fc8));
      uVar28 = -(uint)(DAT_01ff1d40._12_4_ <= ABS(fVar30));
      auVar50._0_4_ = (uint)local_fd8 & uVar25;
      auVar50._4_4_ = (uint)local_fe8 & uVar26;
      auVar50._8_4_ = (uint)local_fc8 & uVar27;
      auVar50._12_4_ = (uint)fVar30 & uVar28;
      auVar42._0_4_ = ~uVar25 & (uint)(float)DAT_01ff1d40;
      auVar42._4_4_ = ~uVar26 & (uint)DAT_01ff1d40._4_4_;
      auVar42._8_4_ = ~uVar27 & (uint)DAT_01ff1d40._8_4_;
      auVar42._12_4_ = ~uVar28 & (uint)DAT_01ff1d40._12_4_;
      auVar42 = auVar42 | auVar50;
      auVar57 = rcpps(auVar50,auVar42);
      local_1068 = auVar57._0_4_;
      local_1078 = auVar57._4_4_;
      local_1038 = auVar57._8_4_;
      local_1068 = (1.0 - auVar42._0_4_ * local_1068) * local_1068 + local_1068;
      local_1078 = (1.0 - auVar42._4_4_ * local_1078) * local_1078 + local_1078;
      local_1038 = (1.0 - auVar42._8_4_ * local_1038) * local_1038 + local_1038;
      fStack_fd4 = local_fd8;
      fStack_fd0 = local_fd8;
      fStack_fcc = local_fd8;
      fStack_fe4 = local_fe8;
      fStack_fe0 = local_fe8;
      fStack_fdc = local_fe8;
      fStack_fc4 = local_fc8;
      fStack_fc0 = local_fc8;
      fStack_fbc = local_fc8;
      uVar22 = (ulong)(local_1068 < 0.0) * 0x10;
      uVar19 = (ulong)(local_1078 < 0.0) << 4 | 0x20;
      uVar21 = (ulong)(local_1038 < 0.0) << 4 | 0x40;
      local_1090 = uVar22 ^ 0x10;
      fStack_1014 = local_1018;
      fStack_1010 = local_1018;
      fStack_100c = local_1018;
      fStack_1024 = local_1028;
      fStack_1020 = local_1028;
      fStack_101c = local_1028;
      fStack_1044 = local_1048;
      fStack_1040 = local_1048;
      fStack_103c = local_1048;
      fStack_1054 = local_1058;
      fStack_1050 = local_1058;
      fStack_104c = local_1058;
      fStack_1034 = local_1038;
      fStack_1030 = local_1038;
      fStack_102c = local_1038;
      fStack_1064 = local_1068;
      fStack_1060 = local_1068;
      fStack_105c = local_1068;
      fStack_1074 = local_1078;
      fStack_1070 = local_1078;
      fStack_106c = local_1078;
      uVar18 = local_1090;
      fVar30 = fVar31;
      fVar29 = fVar31;
      fVar32 = fVar31;
      fVar49 = local_1028;
      fVar77 = local_1028;
      fVar68 = local_1028;
      fVar69 = local_1028;
      fVar70 = local_1068;
      fVar78 = local_1068;
      fVar74 = local_1068;
      fVar75 = local_1068;
      fVar76 = local_1018;
      fVar80 = local_1018;
      fVar81 = local_1018;
      fVar98 = local_1018;
      fVar99 = local_1058;
      fVar100 = local_1058;
      fVar101 = local_1058;
      fVar102 = local_1058;
      fVar93 = local_1048;
      fVar95 = local_1048;
      fVar96 = local_1048;
      fVar97 = local_1048;
      fVar82 = local_1038;
      fVar85 = local_1038;
      fVar86 = local_1038;
      fVar87 = local_1038;
      fVar88 = local_1078;
      fVar91 = local_1078;
      fVar92 = local_1078;
      fVar94 = local_1078;
      do {
        do {
          if (pauVar23 == (undefined1 (*) [16])&local_f78) {
            return;
          }
          pauVar14 = pauVar23 + -1;
          pauVar23 = pauVar23 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar14 + 8));
        uVar17 = *(ulong *)*pauVar23;
        do {
          if ((uVar17 & 0xf) == 0) {
            pfVar1 = (float *)(uVar17 + 0x20 + uVar22);
            auVar33._0_4_ = (*pfVar1 - fVar93) * fVar70;
            auVar33._4_4_ = (pfVar1[1] - fVar95) * fVar78;
            auVar33._8_4_ = (pfVar1[2] - fVar96) * fVar74;
            auVar33._12_4_ = (pfVar1[3] - fVar97) * fVar75;
            pfVar1 = (float *)(uVar17 + 0x20 + uVar19);
            auVar43._0_4_ = (*pfVar1 - fVar99) * fVar88;
            auVar43._4_4_ = (pfVar1[1] - fVar100) * fVar91;
            auVar43._8_4_ = (pfVar1[2] - fVar101) * fVar92;
            auVar43._12_4_ = (pfVar1[3] - fVar102) * fVar94;
            auVar57 = maxps(auVar33,auVar43);
            pfVar1 = (float *)(uVar17 + 0x20 + uVar21);
            auVar44._0_4_ = (*pfVar1 - fVar76) * fVar82;
            auVar44._4_4_ = (pfVar1[1] - fVar80) * fVar85;
            auVar44._8_4_ = (pfVar1[2] - fVar81) * fVar86;
            auVar44._12_4_ = (pfVar1[3] - fVar98) * fVar87;
            pfVar1 = (float *)(uVar17 + 0x20 + uVar18);
            auVar51._0_4_ = (*pfVar1 - fVar93) * fVar70;
            auVar51._4_4_ = (pfVar1[1] - fVar95) * fVar78;
            auVar51._8_4_ = (pfVar1[2] - fVar96) * fVar74;
            auVar51._12_4_ = (pfVar1[3] - fVar97) * fVar75;
            pfVar1 = (float *)(uVar17 + 0x20 + (uVar19 ^ 0x10));
            auVar58._0_4_ = (*pfVar1 - fVar99) * fVar88;
            auVar58._4_4_ = (pfVar1[1] - fVar100) * fVar91;
            auVar58._8_4_ = (pfVar1[2] - fVar101) * fVar92;
            auVar58._12_4_ = (pfVar1[3] - fVar102) * fVar94;
            auVar52 = minps(auVar51,auVar58);
            pfVar1 = (float *)(uVar17 + 0x20 + (uVar21 ^ 0x10));
            auVar59._0_4_ = (*pfVar1 - fVar76) * fVar82;
            auVar59._4_4_ = (pfVar1[1] - fVar80) * fVar85;
            auVar59._8_4_ = (pfVar1[2] - fVar81) * fVar86;
            auVar59._12_4_ = (pfVar1[3] - fVar98) * fVar87;
            auVar7._4_4_ = fVar77;
            auVar7._0_4_ = fVar49;
            auVar7._8_4_ = fVar68;
            auVar7._12_4_ = fVar69;
            auVar45 = maxps(auVar44,auVar7);
            local_10a8 = maxps(auVar57,auVar45);
            auVar6._4_4_ = fVar30;
            auVar6._0_4_ = fVar31;
            auVar6._8_4_ = fVar29;
            auVar6._12_4_ = fVar32;
            auVar57 = minps(auVar59,auVar6);
            auVar57 = minps(auVar52,auVar57);
            auVar34._4_4_ = -(uint)(local_10a8._4_4_ <= auVar57._4_4_);
            auVar34._0_4_ = -(uint)(local_10a8._0_4_ <= auVar57._0_4_);
            auVar34._8_4_ = -(uint)(local_10a8._8_4_ <= auVar57._8_4_);
            auVar34._12_4_ = -(uint)(local_10a8._12_4_ <= auVar57._12_4_);
            uVar24 = movmskps((int)unaff_R15,auVar34);
LAB_00de4aee:
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar24);
            bVar13 = true;
          }
          else {
            if ((int)(uVar17 & 0xf) == 2) {
              uVar16 = uVar17 & 0xfffffffffffffff0;
              local_1008 = *(float *)(uVar16 + 0x60);
              fStack_1004 = *(float *)(uVar16 + 100);
              fStack_1000 = *(float *)(uVar16 + 0x68);
              fStack_ffc = *(float *)(uVar16 + 0x6c);
              local_ff8 = *(float *)(uVar16 + 0x70);
              fStack_ff4 = *(float *)(uVar16 + 0x74);
              fStack_ff0 = *(float *)(uVar16 + 0x78);
              fStack_fec = *(float *)(uVar16 + 0x7c);
              fVar99 = local_fd8 * *(float *)(uVar16 + 0x20) +
                       local_fe8 * *(float *)(uVar16 + 0x50) + local_fc8 * *(float *)(uVar16 + 0x80)
              ;
              fVar100 = fStack_fd4 * *(float *)(uVar16 + 0x24) +
                        fStack_fe4 * *(float *)(uVar16 + 0x54) +
                        fStack_fc4 * *(float *)(uVar16 + 0x84);
              fVar101 = fStack_fd0 * *(float *)(uVar16 + 0x28) +
                        fStack_fe0 * *(float *)(uVar16 + 0x58) +
                        fStack_fc0 * *(float *)(uVar16 + 0x88);
              fVar102 = fStack_fcc * *(float *)(uVar16 + 0x2c) +
                        fStack_fdc * *(float *)(uVar16 + 0x5c) +
                        fStack_fbc * *(float *)(uVar16 + 0x8c);
              fVar49 = local_fd8 * *(float *)(uVar16 + 0x30) +
                       local_fe8 * local_1008 + local_fc8 * *(float *)(uVar16 + 0x90);
              fVar77 = fStack_fd4 * *(float *)(uVar16 + 0x34) +
                       fStack_fe4 * fStack_1004 + fStack_fc4 * *(float *)(uVar16 + 0x94);
              fVar68 = fStack_fd0 * *(float *)(uVar16 + 0x38) +
                       fStack_fe0 * fStack_1000 + fStack_fc0 * *(float *)(uVar16 + 0x98);
              fVar69 = fStack_fcc * *(float *)(uVar16 + 0x3c) +
                       fStack_fdc * fStack_ffc + fStack_fbc * *(float *)(uVar16 + 0x9c);
              fVar70 = local_fd8 * *(float *)(uVar16 + 0x40) +
                       local_fe8 * local_ff8 + local_fc8 * *(float *)(uVar16 + 0xa0);
              fVar78 = fStack_fd4 * *(float *)(uVar16 + 0x44) +
                       fStack_fe4 * fStack_ff4 + fStack_fc4 * *(float *)(uVar16 + 0xa4);
              fVar74 = fStack_fd0 * *(float *)(uVar16 + 0x48) +
                       fStack_fe0 * fStack_ff0 + fStack_fc0 * *(float *)(uVar16 + 0xa8);
              fVar75 = fStack_fcc * *(float *)(uVar16 + 0x4c) +
                       fStack_fdc * fStack_fec + fStack_fbc * *(float *)(uVar16 + 0xac);
              fVar76 = (float)DAT_01ff1d40;
              fVar80 = DAT_01ff1d40._4_4_;
              fVar81 = DAT_01ff1d40._8_4_;
              fVar98 = DAT_01ff1d40._12_4_;
              uVar25 = -(uint)(fVar76 <= ABS(fVar99));
              uVar26 = -(uint)(fVar80 <= ABS(fVar100));
              uVar27 = -(uint)(fVar81 <= ABS(fVar101));
              uVar28 = -(uint)(fVar98 <= ABS(fVar102));
              auVar83._0_4_ = ~uVar25 & (uint)fVar76;
              auVar83._4_4_ = ~uVar26 & (uint)fVar80;
              auVar83._8_4_ = ~uVar27 & (uint)fVar81;
              auVar83._12_4_ = ~uVar28 & (uint)fVar98;
              auVar11._4_4_ = (uint)fVar100 & uVar26;
              auVar11._0_4_ = (uint)fVar99 & uVar25;
              auVar11._8_4_ = (uint)fVar101 & uVar27;
              auVar11._12_4_ = (uint)fVar102 & uVar28;
              auVar83 = auVar83 | auVar11;
              uVar25 = -(uint)(fVar76 <= ABS(fVar49));
              uVar26 = -(uint)(fVar80 <= ABS(fVar77));
              uVar27 = -(uint)(fVar81 <= ABS(fVar68));
              uVar28 = -(uint)(fVar98 <= ABS(fVar69));
              auVar35._0_4_ = (uint)fVar49 & uVar25;
              auVar35._4_4_ = (uint)fVar77 & uVar26;
              auVar35._8_4_ = (uint)fVar68 & uVar27;
              auVar35._12_4_ = (uint)fVar69 & uVar28;
              auVar89._0_4_ = ~uVar25 & (uint)fVar76;
              auVar89._4_4_ = ~uVar26 & (uint)fVar80;
              auVar89._8_4_ = ~uVar27 & (uint)fVar81;
              auVar89._12_4_ = ~uVar28 & (uint)fVar98;
              auVar89 = auVar89 | auVar35;
              uVar25 = -(uint)(fVar76 <= ABS(fVar70));
              uVar26 = -(uint)(fVar80 <= ABS(fVar78));
              uVar27 = -(uint)(fVar81 <= ABS(fVar74));
              uVar28 = -(uint)(fVar98 <= ABS(fVar75));
              auVar36._0_4_ = ~uVar25 & (uint)fVar76;
              auVar36._4_4_ = ~uVar26 & (uint)fVar80;
              auVar36._8_4_ = ~uVar27 & (uint)fVar81;
              auVar36._12_4_ = ~uVar28 & (uint)fVar98;
              auVar8._4_4_ = (uint)fVar78 & uVar26;
              auVar8._0_4_ = (uint)fVar70 & uVar25;
              auVar8._8_4_ = (uint)fVar74 & uVar27;
              auVar8._12_4_ = (uint)fVar75 & uVar28;
              auVar36 = auVar36 | auVar8;
              auVar57 = rcpps(_DAT_01ff1d40,auVar83);
              fVar74 = auVar57._0_4_;
              fVar75 = auVar57._4_4_;
              fVar76 = auVar57._8_4_;
              fVar80 = auVar57._12_4_;
              fVar74 = (1.0 - auVar83._0_4_ * fVar74) * fVar74 + fVar74;
              fVar75 = (1.0 - auVar83._4_4_ * fVar75) * fVar75 + fVar75;
              fVar76 = (1.0 - auVar83._8_4_ * fVar76) * fVar76 + fVar76;
              fVar80 = (1.0 - auVar83._12_4_ * fVar80) * fVar80 + fVar80;
              auVar57 = rcpps(auVar57,auVar89);
              fVar81 = auVar57._0_4_;
              fVar98 = auVar57._4_4_;
              fVar99 = auVar57._8_4_;
              fVar100 = auVar57._12_4_;
              fVar81 = (1.0 - auVar89._0_4_ * fVar81) * fVar81 + fVar81;
              fVar98 = (1.0 - auVar89._4_4_ * fVar98) * fVar98 + fVar98;
              fVar99 = (1.0 - auVar89._8_4_ * fVar99) * fVar99 + fVar99;
              fVar100 = (1.0 - auVar89._12_4_ * fVar100) * fVar100 + fVar100;
              auVar57 = rcpps(auVar57,auVar36);
              fVar101 = auVar57._0_4_;
              fVar102 = auVar57._4_4_;
              fVar93 = auVar57._8_4_;
              fVar95 = auVar57._12_4_;
              fVar101 = (1.0 - auVar36._0_4_ * fVar101) * fVar101 + fVar101;
              fVar102 = (1.0 - auVar36._4_4_ * fVar102) * fVar102 + fVar102;
              fVar93 = (1.0 - auVar36._8_4_ * fVar93) * fVar93 + fVar93;
              fVar95 = (1.0 - auVar36._12_4_ * fVar95) * fVar95 + fVar95;
              auVar12._4_4_ = fStack_1024;
              auVar12._0_4_ = local_1028;
              auVar12._8_4_ = fStack_1020;
              auVar12._12_4_ = fStack_101c;
              uVar25 = (uint)DAT_01fec6d0;
              uVar26 = DAT_01fec6d0._4_4_;
              uVar27 = DAT_01fec6d0._8_4_;
              uVar28 = DAT_01fec6d0._12_4_;
              fVar70 = (*(float *)(uVar16 + 0x20) * local_1048 +
                       *(float *)(uVar16 + 0x50) * local_1058 +
                       *(float *)(uVar16 + 0x80) * local_1018 + *(float *)(uVar16 + 0xb0)) *
                       (float)((uint)fVar74 ^ uVar25);
              fVar78 = (*(float *)(uVar16 + 0x24) * fStack_1044 +
                       *(float *)(uVar16 + 0x54) * fStack_1054 +
                       *(float *)(uVar16 + 0x84) * fStack_1014 + *(float *)(uVar16 + 0xb4)) *
                       (float)((uint)fVar75 ^ uVar26);
              auVar65._0_8_ = CONCAT44(fVar78,fVar70);
              auVar65._8_4_ =
                   (*(float *)(uVar16 + 0x28) * fStack_1040 +
                   *(float *)(uVar16 + 0x58) * fStack_1050 +
                   *(float *)(uVar16 + 0x88) * fStack_1010 + *(float *)(uVar16 + 0xb8)) *
                   (float)((uint)fVar76 ^ uVar27);
              auVar65._12_4_ =
                   (*(float *)(uVar16 + 0x2c) * fStack_103c +
                   *(float *)(uVar16 + 0x5c) * fStack_104c +
                   *(float *)(uVar16 + 0x8c) * fStack_100c + *(float *)(uVar16 + 0xbc)) *
                   (float)((uint)fVar80 ^ uVar28);
              fVar49 = (*(float *)(uVar16 + 0x30) * local_1048 +
                       local_1008 * local_1058 +
                       *(float *)(uVar16 + 0x90) * local_1018 + *(float *)(uVar16 + 0xc0)) *
                       (float)((uint)fVar81 ^ uVar25);
              fVar77 = (*(float *)(uVar16 + 0x34) * fStack_1044 +
                       fStack_1004 * fStack_1054 +
                       *(float *)(uVar16 + 0x94) * fStack_1014 + *(float *)(uVar16 + 0xc4)) *
                       (float)((uint)fVar98 ^ uVar26);
              auVar46._0_8_ = CONCAT44(fVar77,fVar49);
              auVar46._8_4_ =
                   (*(float *)(uVar16 + 0x38) * fStack_1040 +
                   fStack_1000 * fStack_1050 +
                   *(float *)(uVar16 + 0x98) * fStack_1010 + *(float *)(uVar16 + 200)) *
                   (float)((uint)fVar99 ^ uVar27);
              auVar46._12_4_ =
                   (*(float *)(uVar16 + 0x3c) * fStack_103c +
                   fStack_ffc * fStack_104c +
                   *(float *)(uVar16 + 0x9c) * fStack_100c + *(float *)(uVar16 + 0xcc)) *
                   (float)((uint)fVar100 ^ uVar28);
              fVar68 = (*(float *)(uVar16 + 0x40) * local_1048 +
                       local_ff8 * local_1058 +
                       *(float *)(uVar16 + 0xa0) * local_1018 + *(float *)(uVar16 + 0xd0)) *
                       (float)((uint)fVar101 ^ uVar25);
              fVar69 = (*(float *)(uVar16 + 0x44) * fStack_1044 +
                       fStack_ff4 * fStack_1054 +
                       *(float *)(uVar16 + 0xa4) * fStack_1014 + *(float *)(uVar16 + 0xd4)) *
                       (float)((uint)fVar102 ^ uVar26);
              auVar53._0_8_ = CONCAT44(fVar69,fVar68);
              auVar53._8_4_ =
                   (*(float *)(uVar16 + 0x48) * fStack_1040 +
                   fStack_ff0 * fStack_1050 +
                   *(float *)(uVar16 + 0xa8) * fStack_1010 + *(float *)(uVar16 + 0xd8)) *
                   (float)((uint)fVar93 ^ uVar27);
              auVar53._12_4_ =
                   (*(float *)(uVar16 + 0x4c) * fStack_103c +
                   fStack_fec * fStack_104c +
                   *(float *)(uVar16 + 0xac) * fStack_100c + *(float *)(uVar16 + 0xdc)) *
                   (float)((uint)fVar95 ^ uVar28);
              fVar74 = fVar74 + fVar70;
              fVar75 = fVar75 + fVar78;
              fVar76 = fVar76 + auVar65._8_4_;
              fVar80 = fVar80 + auVar65._12_4_;
              auVar84._0_4_ = fVar81 + fVar49;
              auVar84._4_4_ = fVar98 + fVar77;
              auVar84._8_4_ = fVar99 + auVar46._8_4_;
              auVar84._12_4_ = fVar100 + auVar46._12_4_;
              auVar90._0_4_ = fVar101 + fVar68;
              auVar90._4_4_ = fVar102 + fVar69;
              auVar90._8_4_ = fVar93 + auVar53._8_4_;
              auVar90._12_4_ = fVar95 + auVar53._12_4_;
              auVar37._8_4_ = auVar46._8_4_;
              auVar37._0_8_ = auVar46._0_8_;
              auVar37._12_4_ = auVar46._12_4_;
              auVar57 = minps(auVar37,auVar84);
              auVar60._8_4_ = auVar53._8_4_;
              auVar60._0_8_ = auVar53._0_8_;
              auVar60._12_4_ = auVar53._12_4_;
              auVar45 = minps(auVar60,auVar90);
              auVar57 = maxps(auVar57,auVar45);
              auVar61._8_4_ = auVar65._8_4_;
              auVar61._0_8_ = auVar65._0_8_;
              auVar61._12_4_ = auVar65._12_4_;
              auVar9._4_4_ = fVar75;
              auVar9._0_4_ = fVar74;
              auVar9._8_4_ = fVar76;
              auVar9._12_4_ = fVar80;
              auVar67 = minps(auVar61,auVar9);
              auVar10._4_4_ = fVar75;
              auVar10._0_4_ = fVar74;
              auVar10._8_4_ = fVar76;
              auVar10._12_4_ = fVar80;
              auVar73 = maxps(auVar65,auVar10);
              auVar45 = maxps(auVar46,auVar84);
              auVar52 = maxps(auVar53,auVar90);
              auVar45 = minps(auVar45,auVar52);
              auVar52 = maxps(auVar12,auVar67);
              local_10a8 = maxps(auVar52,auVar57);
              auVar38._4_4_ = fVar30;
              auVar38._0_4_ = fVar31;
              auVar38._8_4_ = fVar29;
              auVar38._12_4_ = fVar32;
              auVar57 = minps(auVar38,auVar73);
              auVar57 = minps(auVar57,auVar45);
              auVar54._4_4_ = -(uint)(local_10a8._4_4_ <= auVar57._4_4_);
              auVar54._0_4_ = -(uint)(local_10a8._0_4_ <= auVar57._0_4_);
              auVar54._8_4_ = -(uint)(local_10a8._8_4_ <= auVar57._8_4_);
              auVar54._12_4_ = -(uint)(local_10a8._12_4_ <= auVar57._12_4_);
              uVar24 = movmskps((int)unaff_R15,auVar54);
              fVar49 = local_1028;
              fVar77 = fStack_1024;
              fVar68 = fStack_1020;
              fVar69 = fStack_101c;
              fVar70 = local_1068;
              fVar78 = fStack_1064;
              fVar74 = fStack_1060;
              fVar75 = fStack_105c;
              fVar76 = local_1018;
              fVar80 = fStack_1014;
              fVar81 = fStack_1010;
              fVar98 = fStack_100c;
              fVar99 = local_1058;
              fVar100 = fStack_1054;
              fVar101 = fStack_1050;
              fVar102 = fStack_104c;
              fVar93 = local_1048;
              fVar95 = fStack_1044;
              fVar96 = fStack_1040;
              fVar97 = fStack_103c;
              fVar82 = local_1038;
              fVar85 = fStack_1034;
              fVar86 = fStack_1030;
              fVar87 = fStack_102c;
              fVar88 = local_1078;
              fVar91 = fStack_1074;
              fVar92 = fStack_1070;
              fVar94 = fStack_106c;
              goto LAB_00de4aee;
            }
            bVar13 = false;
          }
          if (bVar13) {
            if (unaff_R15 == 0) {
              iVar15 = 4;
            }
            else {
              uVar16 = uVar17 & 0xfffffffffffffff0;
              lVar5 = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                }
              }
              iVar15 = 0;
              uVar17 = *(ulong *)(uVar16 + lVar5 * 8);
              uVar20 = unaff_R15 - 1 & unaff_R15;
              if (uVar20 != 0) {
                uVar25 = *(uint *)(local_10a8 + lVar5 * 4);
                lVar5 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                  }
                }
                uVar4 = *(ulong *)(uVar16 + lVar5 * 8);
                uVar26 = *(uint *)(local_10a8 + lVar5 * 4);
                uVar20 = uVar20 - 1 & uVar20;
                if (uVar20 == 0) {
                  if (uVar25 < uVar26) {
                    *(ulong *)*pauVar23 = uVar4;
                    *(uint *)((long)*pauVar23 + 8) = uVar26;
                    pauVar23 = pauVar23 + 1;
                  }
                  else {
                    *(ulong *)*pauVar23 = uVar17;
                    *(uint *)((long)*pauVar23 + 8) = uVar25;
                    uVar17 = uVar4;
                    pauVar23 = pauVar23 + 1;
                  }
                }
                else {
                  auVar39._8_4_ = uVar25;
                  auVar39._0_8_ = uVar17;
                  auVar39._12_4_ = 0;
                  auVar47._8_4_ = uVar26;
                  auVar47._0_8_ = uVar4;
                  auVar47._12_4_ = 0;
                  lVar5 = 0;
                  if (uVar20 != 0) {
                    for (; (uVar20 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                    }
                  }
                  uVar17 = *(ulong *)(uVar16 + lVar5 * 8);
                  iVar2 = *(int *)(local_10a8 + lVar5 * 4);
                  auVar55._8_4_ = iVar2;
                  auVar55._0_8_ = uVar17;
                  auVar55._12_4_ = 0;
                  auVar62._8_4_ = -(uint)((int)uVar25 < (int)uVar26);
                  uVar20 = uVar20 - 1 & uVar20;
                  if (uVar20 == 0) {
                    auVar62._4_4_ = auVar62._8_4_;
                    auVar62._0_4_ = auVar62._8_4_;
                    auVar62._12_4_ = auVar62._8_4_;
                    auVar57 = auVar39 & auVar62 | ~auVar62 & auVar47;
                    auVar45 = auVar47 & auVar62 | ~auVar62 & auVar39;
                    auVar63._8_4_ = -(uint)(auVar57._8_4_ < iVar2);
                    auVar63._0_8_ = CONCAT44(auVar63._8_4_,auVar63._8_4_);
                    auVar63._12_4_ = auVar63._8_4_;
                    uVar17 = ~auVar63._0_8_ & uVar17 | auVar57._0_8_ & auVar63._0_8_;
                    auVar57 = auVar55 & auVar63 | ~auVar63 & auVar57;
                    auVar40._8_4_ = -(uint)(auVar45._8_4_ < auVar57._8_4_);
                    auVar40._4_4_ = auVar40._8_4_;
                    auVar40._0_4_ = auVar40._8_4_;
                    auVar40._12_4_ = auVar40._8_4_;
                    *pauVar23 = ~auVar40 & auVar45 | auVar57 & auVar40;
                    pauVar23[1] = auVar45 & auVar40 | ~auVar40 & auVar57;
                    pauVar23 = pauVar23 + 2;
                  }
                  else {
                    lVar5 = 0;
                    if (uVar20 != 0) {
                      for (; (uVar20 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
                      }
                    }
                    iVar3 = *(int *)(local_10a8 + lVar5 * 4);
                    auVar66._8_4_ = iVar3;
                    auVar66._0_8_ = *(undefined8 *)(uVar16 + lVar5 * 8);
                    auVar66._12_4_ = 0;
                    auVar64._4_4_ = auVar62._8_4_;
                    auVar64._0_4_ = auVar62._8_4_;
                    auVar64._8_4_ = auVar62._8_4_;
                    auVar64._12_4_ = auVar62._8_4_;
                    auVar57 = auVar39 & auVar64 | ~auVar64 & auVar47;
                    auVar45 = auVar47 & auVar64 | ~auVar64 & auVar39;
                    auVar72._0_4_ = -(uint)(iVar2 < iVar3);
                    auVar72._4_4_ = -(uint)(iVar2 < iVar3);
                    auVar72._8_4_ = -(uint)(iVar2 < iVar3);
                    auVar72._12_4_ = -(uint)(iVar2 < iVar3);
                    auVar52 = auVar55 & auVar72 | ~auVar72 & auVar66;
                    auVar73 = ~auVar72 & auVar55 | auVar66 & auVar72;
                    auVar56._8_4_ = -(uint)(auVar45._8_4_ < auVar73._8_4_);
                    auVar56._4_4_ = auVar56._8_4_;
                    auVar56._0_4_ = auVar56._8_4_;
                    auVar56._12_4_ = auVar56._8_4_;
                    auVar67 = auVar45 & auVar56 | ~auVar56 & auVar73;
                    auVar48._8_4_ = -(uint)(auVar57._8_4_ < auVar52._8_4_);
                    auVar48._0_8_ = CONCAT44(auVar48._8_4_,auVar48._8_4_);
                    auVar48._12_4_ = auVar48._8_4_;
                    uVar17 = auVar57._0_8_ & auVar48._0_8_ | ~auVar48._0_8_ & auVar52._0_8_;
                    auVar57 = ~auVar48 & auVar57 | auVar52 & auVar48;
                    auVar41._8_4_ = -(uint)(auVar57._8_4_ < auVar67._8_4_);
                    auVar41._4_4_ = auVar41._8_4_;
                    auVar41._0_4_ = auVar41._8_4_;
                    auVar41._12_4_ = auVar41._8_4_;
                    *pauVar23 = ~auVar56 & auVar45 | auVar73 & auVar56;
                    pauVar23[1] = ~auVar41 & auVar57 | auVar67 & auVar41;
                    pauVar23[2] = auVar57 & auVar41 | ~auVar41 & auVar67;
                    pauVar23 = pauVar23 + 3;
                  }
                }
              }
            }
          }
          else {
            iVar15 = 6;
          }
        } while (iVar15 == 0);
        if (iVar15 == 6) {
          (**(code **)((long)local_1088->leafIntersector +
                      (ulong)*(byte *)(uVar17 & 0xfffffffffffffff0) * 0x40))
                    (local_fb8,ray,local_1080);
          fVar31 = (ray->super_RayK<1>).tfar;
          uVar18 = local_1090;
          fVar30 = fVar31;
          fVar29 = fVar31;
          fVar32 = fVar31;
          fVar49 = local_1028;
          fVar77 = fStack_1024;
          fVar68 = fStack_1020;
          fVar69 = fStack_101c;
          fVar70 = local_1068;
          fVar78 = fStack_1064;
          fVar74 = fStack_1060;
          fVar75 = fStack_105c;
          fVar76 = local_1018;
          fVar80 = fStack_1014;
          fVar81 = fStack_1010;
          fVar98 = fStack_100c;
          fVar99 = local_1058;
          fVar100 = fStack_1054;
          fVar101 = fStack_1050;
          fVar102 = fStack_104c;
          fVar93 = local_1048;
          fVar95 = fStack_1044;
          fVar96 = fStack_1040;
          fVar97 = fStack_103c;
          fVar82 = local_1038;
          fVar85 = fStack_1034;
          fVar86 = fStack_1030;
          fVar87 = fStack_102c;
          fVar88 = local_1078;
          fVar91 = fStack_1074;
          fVar92 = fStack_1070;
          fVar94 = fStack_106c;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }